

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geoplg.cpp
# Opt level: O3

Stream * rw::readNativeData(Stream *stream,int32 len,void *object,int32 o,int32 s)

{
  uint32 uVar1;
  Stream *pSVar2;
  ChunkHeaderInfo header;
  ChunkHeaderInfo local_40;
  
  (*stream->_vptr_Stream[5])(stream,0xfffffffc,1);
  uVar1 = Stream::readU32(stream);
  readChunkHeaderInfo(stream,&local_40);
  if (local_40.type == 1) {
    if ((int)local_40.version < 0x31001) {
      local_40.version = (int)local_40.version >> 8;
    }
    else {
      local_40.version =
           ((local_40.version & 0x3f) << 0x10 | (local_40.version & 0x3ff00) << 0xe) +
           (uint)(ushort)local_40.build + 0x40000000;
    }
    if (local_40.version == uVar1) {
      uVar1 = Stream::readU32(stream);
      (*stream->_vptr_Stream[5])(stream,0xfffffff0,1);
      switch(uVar1) {
      case 4:
        pSVar2 = ps2::readNativeData(stream,len,object,o,s);
        return pSVar2;
      case 5:
        pSVar2 = xbox::readNativeData(stream,len,object,o,s);
        return pSVar2;
      default:
        readNativeData();
        return stream;
      case 8:
        pSVar2 = d3d8::readNativeData(stream,len,object,o,s);
        return pSVar2;
      case 9:
        pSVar2 = d3d9::readNativeData(stream,len,object,o,s);
        return pSVar2;
      }
    }
  }
  (*stream->_vptr_Stream[5])(stream,0xfffffff4,1);
  wdgl::readNativeData(stream,len,object,o,s);
  return stream;
}

Assistant:

static Stream*
readNativeData(Stream *stream, int32 len, void *object, int32 o, int32 s)
{
	ChunkHeaderInfo header;
	uint32 libid;
	uint32 platform;
	// ugly hack to find out platform
	stream->seek(-4);
	libid = stream->readU32();
	readChunkHeaderInfo(stream, &header);
	if(header.type == ID_STRUCT &&
	   libraryIDPack(header.version, header.build) == libid){
		platform = stream->readU32();
		stream->seek(-16);
		if(platform == PLATFORM_PS2)
			return ps2::readNativeData(stream, len, object, o, s);
		else if(platform == PLATFORM_XBOX)
			return xbox::readNativeData(stream, len, object, o, s);
		else if(platform == PLATFORM_D3D8)
			return d3d8::readNativeData(stream, len, object, o, s);
		else if(platform == PLATFORM_D3D9)
			return d3d9::readNativeData(stream, len, object, o, s);
		else{
			fprintf(stderr, "unknown platform %d\n", platform);
			stream->seek(len);
		}
	}else{
		stream->seek(-12);
		wdgl::readNativeData(stream, len, object, o, s);
	}
	return stream;
}